

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O0

void draw_circle(Fl_Color col)

{
  Fl_Color col_local;
  
  fl_color(col);
  fl_begin_polygon();
  fl_circle(0.0,0.0,1.0);
  fl_end_polygon();
  set_outline_color(col);
  fl_begin_loop();
  fl_circle(0.0,0.0,1.0);
  fl_end_loop();
  return;
}

Assistant:

static void draw_circle(Fl_Color col) {
  fl_color(col); BP; fl_circle(0,0,1); EP;
  set_outline_color(col);
  BC; fl_circle(0,0,1); EC;
}